

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O3

void __thiscall YM3812::YM3812(YM3812 *this,bool stereo)

{
  INT32 *pIVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int iVar24;
  int iVar25;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  double local_58;
  double dStack_50;
  
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPLEmul_006ef128;
  if (init_tables()::did_init == '\0') {
    piVar10 = tl_tab;
    lVar12 = 0;
    do {
      lVar11 = lVar12 + 1;
      dVar14 = exp2((double)(int)lVar11 * -0.00390625);
      dVar14 = floor(dVar14 * 65536.0);
      uVar7 = ((int)dVar14 >> 4) + 1U & 0xfffffffe;
      tl_tab[lVar12 * 2] = uVar7;
      tl_tab[lVar12 * 2 + 1] = -uVar7;
      lVar9 = 0x804;
      bVar6 = 1;
      do {
        *(int *)((long)piVar10 + lVar9 + -4) = tl_tab[lVar12 * 2] >> (bVar6 & 0x1f);
        *(int *)((long)piVar10 + lVar9) =
             (0 >> (bVar6 & 0x1f)) - tl_tab[lVar12 * 2] >> (bVar6 & 0x1f);
        lVar9 = lVar9 + 0x800;
        bVar6 = bVar6 + 1;
      } while (lVar9 != 0x6004);
      piVar10 = piVar10 + 2;
      lVar12 = lVar11;
    } while (lVar11 != 0x100);
    iVar13 = 0;
    iVar24 = 1;
    iVar25 = 2;
    iVar26 = 3;
    lVar12 = 0;
    do {
      auVar27._4_4_ = iVar24 * 2;
      auVar27._0_4_ = iVar13 * 2;
      auVar27._8_4_ = iVar25 * 2;
      auVar27._12_4_ = iVar26 * 2;
      auVar27 = auVar27 | _DAT_005dd390;
      auVar30._4_4_ = 0;
      auVar30._0_4_ = auVar27._8_4_;
      auVar30._8_4_ = auVar27._12_4_;
      auVar30._12_4_ = 0;
      dVar14 = (double)DAT_005dc8b0;
      dVar16 = DAT_005dc8b0._8_8_;
      auVar28._0_8_ = auVar27._0_8_ & 0xffffffff;
      auVar28._8_4_ = auVar27._4_4_;
      auVar28._12_4_ = 0;
      auVar28 = auVar28 | _DAT_005dc8b0;
      dVar29 = (SUB168(auVar30 | _DAT_005dc8b0,0) - dVar14) * 0.0030679615757712823;
      dVar31 = (SUB168(auVar30 | _DAT_005dc8b0,8) - dVar16) * 0.0030679615757712823;
      dVar15 = sin(dVar29);
      uStack_84 = (undefined4)((ulong)dVar29 >> 0x20);
      uStack_80 = SUB84(dVar31,0);
      uStack_7c = (undefined4)((ulong)dVar31 >> 0x20);
      auVar2._4_8_ = extraout_XMM0_Qb;
      auVar2._0_4_ = uStack_84;
      auVar33._0_8_ = auVar2._0_8_ << 0x20;
      auVar33._8_4_ = uStack_80;
      auVar33._12_4_ = uStack_7c;
      dVar29 = sin(auVar33._8_8_);
      dVar14 = sin((auVar28._0_8_ - dVar14) * 0.0030679615757712823);
      dVar16 = sin((auVar28._8_8_ - dVar16) * 0.0030679615757712823);
      auVar4._8_8_ = dVar29;
      auVar4._0_8_ = dVar15;
      auVar20._0_8_ = -(ulong)(0.0 < dVar15) & 0x3ff0000000000000;
      auVar20._8_8_ = -(ulong)(0.0 < dVar29) & 0x3ff0000000000000;
      auVar34._0_8_ = ~-(ulong)(0.0 < dVar15) & 0xbff0000000000000;
      auVar34._8_8_ = ~-(ulong)(0.0 < dVar29) & 0xbff0000000000000;
      auVar21._0_8_ = -(ulong)(0.0 < dVar14) & 0x3ff0000000000000;
      auVar21._8_8_ = -(ulong)(0.0 < dVar16) & 0x3ff0000000000000;
      auVar32._0_8_ = ~-(ulong)(0.0 < dVar14) & 0xbff0000000000000;
      auVar32._8_8_ = ~-(ulong)(0.0 < dVar16) & 0xbff0000000000000;
      auVar22._8_4_ = SUB84(dVar16,0);
      auVar22._0_8_ = dVar14;
      auVar22._12_4_ = (int)((ulong)dVar16 >> 0x20);
      auVar33 = divpd(auVar32 | auVar21,auVar22);
      auVar22 = divpd(auVar34 | auVar20,auVar4);
      dVar31 = log(auVar22._0_8_);
      uStack_64 = auVar22._4_4_;
      uStack_60 = auVar22._8_4_;
      uStack_5c = auVar22._12_4_;
      auVar3._4_8_ = extraout_XMM0_Qb_00;
      auVar3._0_4_ = uStack_64;
      auVar23._0_8_ = auVar3._0_8_ << 0x20;
      auVar23._8_4_ = uStack_60;
      auVar23._12_4_ = uStack_5c;
      dVar17 = log(auVar23._8_8_);
      local_58 = auVar33._0_8_;
      dVar18 = log(local_58);
      dStack_50 = auVar33._8_8_;
      dVar19 = log(dStack_50);
      *(uint *)((long)sin_tab + lVar12) =
           ((int)(dVar18 * 738.6598609351493) + 1U & 0xfffffffe) + (uint)(dVar14 < 0.0);
      *(uint *)((long)sin_tab + lVar12 + 4) =
           ((int)(dVar19 * 738.6598609351493) + 1U & 0xfffffffe) + (uint)(dVar16 < 0.0);
      *(uint *)((long)sin_tab + lVar12 + 8) =
           ((int)(dVar31 * 738.6598609351493) + 1U & 0xfffffffe) + (uint)(dVar15 < 0.0);
      *(uint *)((long)sin_tab + lVar12 + 0xc) =
           ((int)(dVar17 * 738.6598609351493) + 1U & 0xfffffffe) + (uint)(dVar29 < 0.0);
      iVar13 = iVar13 + 4;
      iVar24 = iVar24 + 4;
      iVar25 = iVar25 + 4;
      iVar26 = iVar26 + 4;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x1000);
    uVar5 = 0;
    do {
      uVar8 = 0x1800;
      uVar7 = 0x1800;
      if (uVar5 < 0x200) {
        uVar7 = sin_tab[uVar5];
      }
      sin_tab[uVar5 + 0x400] = uVar7;
      sin_tab[uVar5 + 0x800] = sin_tab[(uint)uVar5 & 0x1ff];
      if (((uint)uVar5 >> 8 & 1) == 0) {
        uVar8 = sin_tab[uVar5 & 0xff];
      }
      sin_tab[uVar5 + 0xc00] = uVar8;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x400);
    init_tables()::did_init = '\x01';
  }
  memset(&this->Chip,0,0x17e0);
  auVar22 = _DAT_005dc8b0;
  iVar13 = 0;
  iVar24 = 1;
  iVar25 = 2;
  iVar26 = 3;
  lVar12 = 0x1ed;
  do {
    auVar35._0_4_ = iVar13 << 6;
    auVar36._4_4_ = 0;
    auVar36._0_4_ = iVar25 << 6;
    auVar36._8_4_ = iVar26 << 6;
    auVar36._12_4_ = 0;
    auVar35._4_4_ = 0;
    auVar35._8_4_ = iVar24 << 6;
    auVar35._12_4_ = 0;
    dVar14 = (SUB168(auVar35 | auVar22,0) - auVar22._0_8_) * 63.99987484467331;
    dVar15 = (SUB168(auVar35 | auVar22,8) - auVar22._8_8_) * 63.99987484467331;
    dVar29 = (SUB168(auVar36 | auVar22,0) - auVar22._0_8_) * 63.99987484467331;
    dVar16 = (SUB168(auVar36 | auVar22,8) - auVar22._8_8_) * 63.99987484467331;
    iVar37 = (int)dVar29;
    iVar39 = (int)dVar16;
    iVar38 = (int)dVar14;
    iVar40 = (int)dVar15;
    pIVar1 = (this->Chip).P_CH[0].SLOT[0].op1_out + lVar12 + -0xc;
    *(ulong *)pIVar1 =
         CONCAT44((int)(dVar15 - 2147483648.0),(int)(dVar14 - 2147483648.0)) &
         CONCAT44(iVar40 >> 0x1f,iVar38 >> 0x1f) | CONCAT44(iVar40,iVar38);
    *(ulong *)(pIVar1 + 2) =
         CONCAT44((int)(dVar16 - 2147483648.0),(int)(dVar29 - 2147483648.0)) &
         CONCAT44(iVar39 >> 0x1f,iVar37 >> 0x1f) | CONCAT44(iVar39,iVar37);
    iVar13 = iVar13 + 4;
    iVar24 = iVar24 + 4;
    iVar25 = iVar25 + 4;
    iVar26 = iVar26 + 4;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x5ed);
  (this->Chip).lfo_am_inc = 0x3ffff;
  (this->Chip).lfo_pm_inc = 0x3fff;
  (this->Chip).eg_timer_add = 0xffff;
  (this->Chip).eg_timer_overflow = 0x10000;
  lVar12 = 0xd8;
  do {
    *(undefined8 *)((long)(this->Chip).P_CH[0].SLOT[0].op1_out + lVar12 + -0x30) =
         0x3f3504f33f3504f3;
    lVar12 = lVar12 + 0xd8;
  } while (lVar12 != 0x870);
  (this->Chip).IsStereo = stereo;
  Reset(this);
  return;
}

Assistant:

YM3812(bool stereo)
	{
		init_tables();

		/* clear */
		memset(&Chip, 0, sizeof(Chip));

		/* init global tables */
		OPL_initalize(&Chip);

		Chip.IsStereo = stereo;

		Reset();
	}